

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ckh.c
# Opt level: O0

_Bool ckh_grow(tsd_t *tsd,ckh_t *ckh)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  byte bVar4;
  _Bool _Var5;
  uint uVar6;
  ulong uVar7;
  ulong uVar8;
  void *pvVar9;
  rtree_t *rtree;
  long in_RSI;
  long in_RDI;
  rtree_metadata_t rVar10;
  size_t usize;
  uint lg_curcells;
  uint lg_prevbuckets;
  ckhc_t *ttab;
  ckhc_t *tab;
  _Bool ret;
  size_t usize_1;
  size_t ret_4;
  size_t ret_1;
  size_t usize_3;
  size_t delta_mask_1;
  size_t delta_1;
  size_t lg_delta_1;
  size_t x_1;
  size_t lg_ceil_1;
  size_t lg_tmin_1;
  size_t usize_2;
  size_t delta_mask;
  size_t delta;
  size_t lg_delta;
  size_t x;
  size_t lg_ceil;
  size_t lg_tmin;
  size_t ret_3;
  size_t ret_6;
  szind_t ret_2;
  szind_t ret_5;
  void *ret_7;
  tsd_t *tsd_1;
  tsd_t *tsd_2;
  tsd_t *tsd_3;
  uint8_t state_9;
  uint8_t state_3;
  uint8_t state;
  uint arena_ind_2;
  edata_t *edata_3;
  uint arena_ind_1;
  edata_t *edata_1;
  uint arena_ind;
  edata_t *edata;
  rtree_ctx_t *rtree_ctx;
  rtree_ctx_t rtree_ctx_fallback;
  rtree_ctx_t *rtree_ctx_2;
  rtree_ctx_t rtree_ctx_fallback_2;
  rtree_ctx_t *rtree_ctx_6;
  rtree_ctx_t rtree_ctx_fallback_6;
  void *result;
  void *result_1;
  void *result_2;
  uint8_t state_10;
  uint8_t state_4;
  uint8_t state_1;
  emap_alloc_ctx_t alloc_ctx_3;
  emap_alloc_ctx_t alloc_ctx_1;
  emap_alloc_ctx_t alloc_ctx;
  rtree_metadata_t metadata;
  rtree_ctx_t *rtree_ctx_1;
  rtree_ctx_t rtree_ctx_fallback_1;
  uint8_t state_2;
  rtree_metadata_t metadata_1;
  rtree_ctx_t *rtree_ctx_3;
  rtree_ctx_t rtree_ctx_fallback_3;
  uint8_t state_5;
  rtree_metadata_t metadata_3;
  rtree_ctx_t *rtree_ctx_7;
  rtree_ctx_t rtree_ctx_fallback_7;
  uint8_t state_11;
  size_t ret_8;
  size_t ret_9;
  size_t ret_13;
  uint8_t state_12;
  uint8_t state_6;
  emap_alloc_ctx_t alloc_ctx_2;
  rtree_metadata_t metadata_2;
  rtree_ctx_t *rtree_ctx_4;
  rtree_ctx_t rtree_ctx_fallback_4;
  uint8_t state_7;
  emap_alloc_ctx_t alloc_ctx_4;
  rtree_metadata_t metadata_4;
  rtree_ctx_t *rtree_ctx_8;
  rtree_ctx_t rtree_ctx_fallback_8;
  uint8_t state_13;
  _Bool ret_15;
  uint remain_2;
  cache_bin_sz_t max_1;
  cache_bin_t *bin_2;
  size_t ret_14;
  _Bool ret_11;
  uint remain;
  cache_bin_sz_t max;
  cache_bin_t *bin;
  size_t ret_10;
  edata_t *edata_4;
  _Bool is_sample_promoted_1;
  rtree_ctx_t *rtree_ctx_9;
  rtree_ctx_t rtree_ctx_fallback_9;
  uint8_t state_14;
  edata_t *edata_2;
  _Bool is_sample_promoted;
  rtree_ctx_t *rtree_ctx_5;
  rtree_ctx_t rtree_ctx_fallback_5;
  uint8_t state_8;
  uint16_t diff;
  uint16_t low_bits_head;
  uint16_t diff_1;
  uint16_t low_bits_head_1;
  cache_bin_sz_t ncached_max_1;
  uint nbins_1;
  _Bool disabled_1;
  cache_bin_sz_t ncached_max_3;
  uint nbins_3;
  _Bool disabled_3;
  cache_bin_sz_t ncached_max;
  uint nbins;
  _Bool disabled;
  cache_bin_sz_t ncached_max_2;
  uint nbins_2;
  _Bool disabled_2;
  _Bool ret_12;
  uint remain_1;
  cache_bin_t *bin_1;
  _Bool ret_16;
  uint remain_3;
  cache_bin_t *bin_3;
  arena_t *in_stack_ffffffffffffe0c8;
  undefined7 in_stack_ffffffffffffe0d0;
  undefined1 in_stack_ffffffffffffe0d7;
  undefined4 in_stack_ffffffffffffe0d8;
  undefined4 in_stack_ffffffffffffe0dc;
  arena_t *paVar11;
  ckhc_t *in_stack_ffffffffffffe0f0;
  rtree_ctx_t *in_stack_ffffffffffffe0f8;
  undefined4 in_stack_ffffffffffffe100;
  undefined4 in_stack_ffffffffffffe104;
  tsdn_t *in_stack_ffffffffffffe108;
  undefined4 in_stack_ffffffffffffe110;
  undefined4 in_stack_ffffffffffffe114;
  undefined4 uVar12;
  rtree_ctx_t *in_stack_ffffffffffffe118;
  rtree_ctx_t *rtree_ctx_00;
  rtree_t *in_stack_ffffffffffffe120;
  arena_t *in_stack_ffffffffffffe128;
  undefined4 in_stack_ffffffffffffe130;
  undefined4 in_stack_ffffffffffffe134;
  arena_t *in_stack_ffffffffffffe138;
  tsdn_t *in_stack_ffffffffffffe140;
  ulong local_1e98;
  ulong local_1e88;
  int local_1e78;
  ulong local_1e48;
  ulong local_1e30;
  ulong local_1d80;
  ulong local_1d70;
  ulong local_1d10;
  ulong local_1d08;
  ulong local_1cc8;
  ulong local_1cc0;
  witness_tsdn_t *local_1c10;
  witness_tsdn_t *local_1bf8;
  tcache_t *in_stack_ffffffffffffe420;
  edata_t *local_1a68;
  rtree_ctx_t local_1a48;
  void *local_18c8;
  emap_t *local_18c0;
  edata_t *local_18b0;
  rtree_ctx_t *local_1898;
  rtree_ctx_t local_1890;
  undefined8 local_1710;
  emap_t *local_1708;
  edata_t *local_16f8;
  rtree_ctx_t *local_16e0;
  rtree_ctx_t local_16d8;
  undefined8 local_1558;
  emap_t *local_1550;
  arena_t *paStack_1540;
  undefined4 local_1534;
  arena_t *local_1530;
  undefined4 local_1528;
  undefined4 uStack_1524;
  arena_t *paStack_1520;
  undefined4 local_1514;
  rtree_ctx_t *local_1510;
  undefined4 local_1508;
  undefined4 uStack_1504;
  arena_t *paStack_1500;
  undefined4 local_14f4;
  ckhc_t *local_14f0;
  undefined4 local_14e8;
  undefined4 uStack_14e4;
  rtree_ctx_t *local_14e0;
  rtree_ctx_t *local_14d0;
  rtree_ctx_t *local_14b8;
  rtree_ctx_t *local_14a8;
  rtree_ctx_t *local_1490;
  rtree_ctx_t *local_1480;
  undefined1 local_1449;
  undefined1 local_1431;
  undefined1 local_1419;
  uint auStack_13f0 [2];
  undefined8 uStack_13e8;
  uint auStack_13d8 [2];
  undefined8 uStack_13d0;
  uint auStack_13c0 [2];
  void *pvStack_13b8;
  rtree_metadata_t rStack_13a8;
  undefined8 uStack_1394;
  undefined4 uStack_138c;
  rtree_ctx_t *prStack_1388;
  rtree_ctx_t rStack_1380;
  uint *puStack_1200;
  void *pvStack_11f8;
  emap_t *peStack_11f0;
  rtree_ctx_t *prStack_11e0;
  rtree_ctx_t *prStack_11d0;
  undefined1 uStack_11a9;
  rtree_metadata_t rStack_1190;
  undefined8 uStack_117c;
  undefined4 uStack_1174;
  rtree_ctx_t *prStack_1170;
  rtree_ctx_t rStack_1168;
  uint *puStack_fe8;
  undefined8 uStack_fe0;
  emap_t *peStack_fd8;
  rtree_ctx_t *prStack_fc8;
  rtree_ctx_t *prStack_fb8;
  undefined1 uStack_f91;
  rtree_metadata_t rStack_f78;
  undefined8 uStack_f64;
  undefined4 uStack_f5c;
  rtree_ctx_t *prStack_f58;
  rtree_ctx_t rStack_f50;
  uint *puStack_dd0;
  undefined8 uStack_dc8;
  emap_t *peStack_dc0;
  rtree_ctx_t *prStack_db0;
  rtree_ctx_t *prStack_da0;
  undefined1 uStack_d79;
  uint uStack_d5c;
  size_t sStack_d58;
  uint uStack_d4c;
  uint uStack_d48;
  uint uStack_d44;
  size_t sStack_d40;
  uint uStack_d34;
  uint uStack_d30;
  uint uStack_d2c;
  size_t sStack_d28;
  uint uStack_d20;
  uint uStack_d1c;
  undefined1 local_cb9;
  undefined8 local_cb8;
  undefined8 local_cb0;
  undefined8 local_ca8;
  undefined1 local_a69;
  undefined8 local_a68;
  undefined8 local_a60;
  undefined8 local_a58;
  
  uVar12 = *(undefined4 *)(in_RSI + 0x14);
  local_1e78 = *(int *)(in_RSI + 0x14) + 2;
  do {
    uVar7 = 0x10L << ((byte)(local_1e78 + 1) & 0x3f);
    if (uVar7 < 0x3801) {
      local_1cc8 = uVar7 + 0x3f & 0xffffffffffffffc0;
      if (local_1cc8 < 0x1001) {
        local_1d80 = duckdb_je_sz_index2size_tab[duckdb_je_sz_size2index_tab[local_1cc8 + 7 >> 3]];
      }
      else {
        if (local_1cc8 < 0x7000000000000001) {
          if (local_1cc8 == 0) {
            local_1cc8 = 1;
          }
          if (local_1cc8 < 9) {
            pow2_ceil_zu(0x2595298);
            uVar6 = lg_floor(0x25952a0);
            if (uVar6 < 3) {
              bVar4 = 3;
            }
            else {
              bVar4 = (byte)uVar6 & 0x3f;
            }
            local_1e88 = 1L << bVar4;
            local_1cc0 = local_1e88;
          }
          else {
            uVar6 = lg_floor(0x2595317);
            if (uVar6 < 7) {
              bVar4 = 4;
            }
            else {
              bVar4 = (char)uVar6 - 3;
            }
            uVar8 = (1L << (bVar4 & 0x3f)) - 1;
            local_1cc0 = local_1cc8 + uVar8 & (uVar8 ^ 0xffffffffffffffff);
          }
        }
        else {
          local_1cc0 = 0;
        }
        local_1d80 = local_1cc0;
      }
      if (0x3fff < local_1d80) goto LAB_0259540b;
      local_1e30 = local_1d80;
    }
    else {
LAB_0259540b:
      if (uVar7 < 0x4001) {
        local_1e48 = 0x4000;
      }
      else {
        if (uVar7 < 0x1001) {
          local_1d70 = duckdb_je_sz_index2size_tab[duckdb_je_sz_size2index_tab[uVar7 + 7 >> 3]];
        }
        else {
          if (uVar7 < 0x7000000000000001) {
            local_1d10 = uVar7;
            if (uVar7 == 0) {
              local_1d10 = 1;
            }
            if (local_1d10 < 9) {
              pow2_ceil_zu(0x25955b4);
              uVar6 = lg_floor(0x25955bc);
              if (uVar6 < 3) {
                bVar4 = 3;
              }
              else {
                bVar4 = (byte)uVar6 & 0x3f;
              }
              local_1e98 = 1L << bVar4;
              local_1d08 = local_1e98;
            }
            else {
              uVar6 = lg_floor(0x2595633);
              if (uVar6 < 7) {
                bVar4 = 4;
              }
              else {
                bVar4 = (char)uVar6 - 3;
              }
              uVar8 = (1L << (bVar4 & 0x3f)) - 1;
              local_1d08 = local_1d10 + uVar8 & (uVar8 ^ 0xffffffffffffffff);
            }
          }
          else {
            local_1d08 = 0;
          }
          local_1d70 = local_1d08;
        }
        local_1e48 = local_1d70;
        if (local_1d70 < uVar7) {
          local_1e30 = 0;
          goto LAB_0259577d;
        }
      }
      if (local_1e48 + duckdb_je_sz_large_pad < local_1e48) {
        local_1e30 = 0;
      }
      else {
        local_1e30 = local_1e48;
      }
    }
LAB_0259577d:
    if (local_1e30 == 0 || 0x7000000000000000 < local_1e30) {
      return true;
    }
    arena_ichoose((tsd_t *)CONCAT17(in_stack_ffffffffffffe0d7,in_stack_ffffffffffffe0d0),
                  in_stack_ffffffffffffe0c8);
    if (in_RDI == 0) {
      local_1c10 = (witness_tsdn_t *)0x0;
    }
    else {
      local_1c10 = (witness_tsdn_t *)(in_RDI + 0xa40);
    }
    witness_assert_depth_to_rank(local_1c10,WITNESS_RANK_CORE,0);
    in_stack_ffffffffffffe0c8 = (arena_t *)0x0;
    pvVar9 = duckdb_je_arena_palloc
                       (in_stack_ffffffffffffe140,in_stack_ffffffffffffe138,
                        CONCAT44(in_stack_ffffffffffffe134,in_stack_ffffffffffffe130),
                        (size_t)in_stack_ffffffffffffe128,
                        SUB81((ulong)in_stack_ffffffffffffe120 >> 0x38,0),
                        SUB81((ulong)in_stack_ffffffffffffe120 >> 0x30,0),in_stack_ffffffffffffe420)
    ;
    if (pvVar9 != (void *)0x0) {
      local_18c0 = &duckdb_je_arena_emap_global;
      local_1490 = &local_1a48;
      local_18c8 = pvVar9;
      if (in_RDI == 0) {
        duckdb_je_rtree_ctx_data_init(local_1490);
        local_1480 = local_1490;
      }
      else {
        local_1419 = *(undefined1 *)(in_RDI + 0x338);
        local_1480 = (rtree_ctx_t *)(in_RDI + 0x1b8);
      }
      rtree_read(in_stack_ffffffffffffe108,
                 (rtree_t *)CONCAT44(in_stack_ffffffffffffe104,in_stack_ffffffffffffe100),
                 in_stack_ffffffffffffe0f8,(uintptr_t)in_stack_ffffffffffffe0f0);
      uVar6 = edata_arena_ind_get(local_1a68);
      in_stack_ffffffffffffe138 = (arena_t *)(duckdb_je_arenas + uVar6);
      local_1534 = 0;
      local_1528 = 0;
      in_stack_ffffffffffffe140 = (tsdn_t *)0x0;
      uStack_1524 = 0;
      in_stack_ffffffffffffe134 = 0;
      in_stack_ffffffffffffe128 = *(arena_t **)in_stack_ffffffffffffe138->nthreads;
      peStack_11f0 = &duckdb_je_arena_emap_global;
      puStack_1200 = auStack_13c0;
      prStack_11e0 = &rStack_1380;
      paStack_1540 = in_stack_ffffffffffffe128;
      local_1530 = in_stack_ffffffffffffe138;
      pvStack_13b8 = pvVar9;
      pvStack_11f8 = pvVar9;
      if (in_RDI == 0) {
        duckdb_je_rtree_ctx_data_init(prStack_11e0);
        prStack_11d0 = prStack_11e0;
      }
      else {
        uStack_11a9 = *(undefined1 *)(in_RDI + 0x338);
        prStack_11d0 = (rtree_ctx_t *)(in_RDI + 0x1b8);
      }
      prStack_1388 = prStack_11d0;
      rVar10 = rtree_metadata_read((tsdn_t *)in_stack_ffffffffffffe128,in_stack_ffffffffffffe120,
                                   in_stack_ffffffffffffe118,
                                   CONCAT44(in_stack_ffffffffffffe114,in_stack_ffffffffffffe110));
      rStack_13a8._0_8_ = rVar10._0_8_;
      uStack_1394._0_4_ = rStack_13a8.szind;
      uStack_1394._4_4_ = rStack_13a8.state;
      uVar1 = uStack_1394;
      rStack_13a8._8_4_ = rVar10._8_4_;
      uStack_138c._0_1_ = rStack_13a8.is_head;
      uStack_138c._1_1_ = rStack_13a8.slab;
      uStack_138c._2_2_ = rStack_13a8._10_2_;
      uStack_1394._0_4_ = rVar10.szind;
      rStack_13a8 = rVar10;
      *puStack_1200 = (uint)uStack_1394;
      uStack_1394 = uVar1;
      *(byte *)(puStack_1200 + 1) = uStack_138c._1_1_ & 1;
      uStack_d5c = auStack_13c0[0];
      uStack_d4c = auStack_13c0[0];
      uStack_d48 = auStack_13c0[0];
      sStack_d58 = duckdb_je_sz_index2size_tab[auStack_13c0[0]];
      arena_internal_add(in_stack_ffffffffffffe128,sStack_d58);
    }
    if (pvVar9 == (void *)0x0) {
      return true;
    }
    uVar1 = *(undefined8 *)(in_RSI + 0x28);
    *(void **)(in_RSI + 0x28) = pvVar9;
    *(int *)(in_RSI + 0x14) = local_1e78 + -1;
    _Var5 = ckh_rebuild((ckh_t *)in_stack_ffffffffffffe0f8,in_stack_ffffffffffffe0f0);
    if (!_Var5) {
      if (in_RDI == 0) {
        local_1bf8 = (witness_tsdn_t *)0x0;
      }
      else {
        local_1bf8 = (witness_tsdn_t *)(in_RDI + 0xa40);
      }
      witness_assert_depth_to_rank(local_1bf8,WITNESS_RANK_CORE,0);
      local_1708 = &duckdb_je_arena_emap_global;
      local_14b8 = &local_1890;
      local_1710 = uVar1;
      if (in_RDI == 0) {
        duckdb_je_rtree_ctx_data_init(local_14b8);
        local_14a8 = local_14b8;
      }
      else {
        local_1431 = *(undefined1 *)(in_RDI + 0x338);
        local_14a8 = (rtree_ctx_t *)(in_RDI + 0x1b8);
      }
      local_1898 = local_14a8;
      rtree_read(in_stack_ffffffffffffe108,
                 (rtree_t *)CONCAT44(in_stack_ffffffffffffe104,in_stack_ffffffffffffe100),
                 in_stack_ffffffffffffe0f8,(uintptr_t)in_stack_ffffffffffffe0f0);
      uVar6 = edata_arena_ind_get(local_18b0);
      rtree_ctx_00 = (rtree_ctx_t *)(duckdb_je_arenas + uVar6);
      local_1514 = 0;
      local_1508 = 0;
      rtree = (rtree_t *)0x0;
      uStack_1504 = 0;
      uVar12 = 0;
      paVar11 = (arena_t *)rtree_ctx_00->cache[0].leafkey;
      peStack_fd8 = &duckdb_je_arena_emap_global;
      puStack_fe8 = auStack_13d8;
      prStack_fc8 = &rStack_1168;
      paStack_1520 = paVar11;
      local_1510 = rtree_ctx_00;
      uStack_13d0 = uVar1;
      uStack_fe0 = uVar1;
      if (in_RDI == 0) {
        duckdb_je_rtree_ctx_data_init(prStack_fc8);
        prStack_fb8 = prStack_fc8;
      }
      else {
        uStack_f91 = *(undefined1 *)(in_RDI + 0x338);
        prStack_fb8 = (rtree_ctx_t *)(in_RDI + 0x1b8);
      }
      prStack_1170 = prStack_fb8;
      rVar10 = rtree_metadata_read((tsdn_t *)in_stack_ffffffffffffe128,rtree,rtree_ctx_00,
                                   CONCAT44(uVar12,in_stack_ffffffffffffe110));
      rStack_1190._0_8_ = rVar10._0_8_;
      uStack_117c._0_4_ = rStack_1190.szind;
      uStack_117c._4_4_ = rStack_1190.state;
      uVar2 = uStack_117c;
      rStack_1190._8_4_ = rVar10._8_4_;
      uStack_1174._0_1_ = rStack_1190.is_head;
      uStack_1174._1_1_ = rStack_1190.slab;
      uStack_1174._2_2_ = rStack_1190._10_2_;
      uStack_117c._0_4_ = rVar10.szind;
      rStack_1190 = rVar10;
      *puStack_fe8 = (uint)uStack_117c;
      uStack_117c = uVar2;
      *(byte *)(puStack_fe8 + 1) = uStack_1174._1_1_ & 1;
      uStack_d44 = auStack_13d8[0];
      uStack_d34 = auStack_13d8[0];
      uStack_d30 = auStack_13d8[0];
      sStack_d40 = duckdb_je_sz_index2size_tab[auStack_13d8[0]];
      arena_internal_sub(paVar11,sStack_d40);
      local_cb0 = 0;
      local_cb8 = 0;
      local_cb9 = 1;
      local_ca8 = uVar1;
      arena_dalloc_no_tcache
                ((tsdn_t *)CONCAT44(in_stack_ffffffffffffe0dc,in_stack_ffffffffffffe0d8),
                 (void *)CONCAT17(in_stack_ffffffffffffe0d7,in_stack_ffffffffffffe0d0));
      return false;
    }
    uVar2 = *(undefined8 *)(in_RSI + 0x28);
    if (in_RDI == 0) {
      in_stack_ffffffffffffe420 = (tcache_t *)0x0;
    }
    else {
      in_stack_ffffffffffffe420 = (tcache_t *)(in_RDI + 0xa40);
    }
    witness_assert_depth_to_rank((witness_tsdn_t *)in_stack_ffffffffffffe420,WITNESS_RANK_CORE,0);
    local_1550 = &duckdb_je_arena_emap_global;
    local_14e0 = &local_16d8;
    local_1558 = uVar2;
    if (in_RDI == 0) {
      duckdb_je_rtree_ctx_data_init(local_14e0);
      local_14d0 = local_14e0;
    }
    else {
      local_1449 = *(undefined1 *)(in_RDI + 0x338);
      local_14d0 = (rtree_ctx_t *)(in_RDI + 0x1b8);
    }
    local_16e0 = local_14d0;
    rtree_read(in_stack_ffffffffffffe108,
               (rtree_t *)CONCAT44(in_stack_ffffffffffffe104,in_stack_ffffffffffffe100),
               in_stack_ffffffffffffe0f8,(uintptr_t)in_stack_ffffffffffffe0f0);
    uVar6 = edata_arena_ind_get(local_16f8);
    in_stack_ffffffffffffe0f0 = (ckhc_t *)(duckdb_je_arenas + uVar6);
    local_14f4 = 0;
    local_14e8 = 0;
    in_stack_ffffffffffffe0f8 = (rtree_ctx_t *)0x0;
    uStack_14e4 = 0;
    paVar11 = (arena_t *)in_stack_ffffffffffffe0f0->key;
    peStack_dc0 = &duckdb_je_arena_emap_global;
    puStack_dd0 = auStack_13f0;
    prStack_db0 = &rStack_f50;
    paStack_1500 = paVar11;
    local_14f0 = in_stack_ffffffffffffe0f0;
    uStack_13e8 = uVar2;
    uStack_dc8 = uVar2;
    if (in_RDI == 0) {
      duckdb_je_rtree_ctx_data_init(prStack_db0);
      prStack_da0 = prStack_db0;
    }
    else {
      uStack_d79 = *(undefined1 *)(in_RDI + 0x338);
      prStack_da0 = (rtree_ctx_t *)(in_RDI + 0x1b8);
    }
    prStack_f58 = prStack_da0;
    rVar10 = rtree_metadata_read((tsdn_t *)in_stack_ffffffffffffe128,in_stack_ffffffffffffe120,
                                 in_stack_ffffffffffffe118,
                                 CONCAT44(in_stack_ffffffffffffe114,in_stack_ffffffffffffe110));
    rStack_f78._0_8_ = rVar10._0_8_;
    uStack_f64._0_4_ = rStack_f78.szind;
    uStack_f64._4_4_ = rStack_f78.state;
    uVar3 = uStack_f64;
    rStack_f78._8_4_ = rVar10._8_4_;
    uStack_f5c._0_1_ = rStack_f78.is_head;
    uStack_f5c._1_1_ = rStack_f78.slab;
    uStack_f5c._2_2_ = rStack_f78._10_2_;
    uStack_f64._0_4_ = rVar10.szind;
    rStack_f78 = rVar10;
    *puStack_dd0 = (uint)uStack_f64;
    uStack_f64 = uVar3;
    *(byte *)(puStack_dd0 + 1) = uStack_f5c._1_1_ & 1;
    uStack_d2c = auStack_13f0[0];
    uStack_d20 = auStack_13f0[0];
    uStack_d1c = auStack_13f0[0];
    sStack_d28 = duckdb_je_sz_index2size_tab[auStack_13f0[0]];
    arena_internal_sub(paVar11,sStack_d28);
    local_a60 = 0;
    local_a68 = 0;
    local_a69 = 1;
    local_a58 = uVar2;
    arena_dalloc_no_tcache
              ((tsdn_t *)CONCAT44(in_stack_ffffffffffffe0dc,in_stack_ffffffffffffe0d8),
               (void *)CONCAT17(in_stack_ffffffffffffe0d7,in_stack_ffffffffffffe0d0));
    *(undefined8 *)(in_RSI + 0x28) = uVar1;
    *(undefined4 *)(in_RSI + 0x14) = uVar12;
    local_1e78 = local_1e78 + 1;
  } while( true );
}

Assistant:

static bool
ckh_grow(tsd_t *tsd, ckh_t *ckh) {
	bool ret;
	ckhc_t *tab, *ttab;
	unsigned lg_prevbuckets, lg_curcells;

#ifdef CKH_COUNT
	ckh->ngrows++;
#endif

	/*
	 * It is possible (though unlikely, given well behaved hashes) that the
	 * table will have to be doubled more than once in order to create a
	 * usable table.
	 */
	lg_prevbuckets = ckh->lg_curbuckets;
	lg_curcells = ckh->lg_curbuckets + LG_CKH_BUCKET_CELLS;
	while (true) {
		size_t usize;

		lg_curcells++;
		usize = sz_sa2u(sizeof(ckhc_t) << lg_curcells, CACHELINE);
		if (unlikely(usize == 0
		    || usize > SC_LARGE_MAXCLASS)) {
			ret = true;
			goto label_return;
		}
		tab = (ckhc_t *)ipallocztm(tsd_tsdn(tsd), usize, CACHELINE,
		    true, NULL, true, arena_ichoose(tsd, NULL));
		if (tab == NULL) {
			ret = true;
			goto label_return;
		}
		/* Swap in new table. */
		ttab = ckh->tab;
		ckh->tab = tab;
		tab = ttab;
		ckh->lg_curbuckets = lg_curcells - LG_CKH_BUCKET_CELLS;

		if (!ckh_rebuild(ckh, tab)) {
			idalloctm(tsd_tsdn(tsd), tab, NULL, NULL, true, true);
			break;
		}

		/* Rebuilding failed, so back out partially rebuilt table. */
		idalloctm(tsd_tsdn(tsd), ckh->tab, NULL, NULL, true, true);
		ckh->tab = tab;
		ckh->lg_curbuckets = lg_prevbuckets;
	}

	ret = false;
label_return:
	return ret;
}